

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Template.cpp
# Opt level: O1

bool __thiscall Rml::Template::Load(Template *this,Stream *stream)

{
  _Head_base<0UL,_Rml::StreamMemory_*,_false> this_00;
  Template *pTVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  byte *string;
  char *pcVar4;
  char *string_00;
  char *__s;
  StreamMemory *pSVar5;
  URL *pUVar6;
  DocumentHeader *pDVar7;
  undefined4 uVar8;
  pointer __p;
  UniquePtr<Rml::StreamMemory> header_stream;
  char *ptr;
  String buffer;
  String attribute_value;
  String attribute_name;
  XMLParser parser;
  _Head_base<0UL,_Rml::StreamMemory_*,_false> local_200;
  char *local_1f8;
  undefined4 local_1ec;
  char *local_1e8;
  Stream *local_1e0;
  Template *local_1d8;
  char *local_1d0;
  char *local_1c8;
  undefined8 local_1c0;
  char local_1b8;
  undefined7 uStack_1b7;
  byte *local_1a8;
  char *local_1a0;
  String local_198;
  String local_178;
  __uniq_ptr_impl<Rml::StreamMemory,_std::default_delete<Rml::StreamMemory>_> local_158;
  XMLParser local_150;
  
  local_1c8 = &local_1b8;
  local_1c0 = 0;
  local_1b8 = '\0';
  iVar3 = (*stream->_vptr_Stream[4])(stream);
  (*stream->_vptr_Stream[9])(stream,&local_1c8,CONCAT44(extraout_var,iVar3));
  string = (byte *)XMLParseTools::FindTag("head",local_1c8,false);
  if (string != (byte *)0x0) {
    pcVar4 = XMLParseTools::FindTag("head",(char *)string,true);
    if (pcVar4 != (char *)0x0) {
      pcVar4 = strchr(pcVar4,0x3e);
      string_00 = XMLParseTools::FindTag("body",pcVar4 + 1,false);
      if (string_00 != (char *)0x0) {
        __s = XMLParseTools::FindTag("body",string_00,true);
        if (__s != (char *)0x0) {
          local_1a0 = pcVar4 + 1;
          local_1f8 = strchr(__s,0x3e);
          local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
          local_178._M_string_length = 0;
          local_178.field_2._M_local_buf[0] = '\0';
          local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
          local_198._M_string_length = 0;
          local_198.field_2._M_local_buf[0] = '\0';
          local_1d0 = XMLParseTools::FindTag("template",local_1c8,false);
          local_1ec = (undefined4)CONCAT71((int7)((ulong)local_1d0 >> 8),local_1d0 != (char *)0x0);
          if (local_1d0 != (char *)0x0) {
            local_1f8 = local_1f8 + 1;
            local_1e8 = string_00;
            local_1e0 = stream;
            local_1d8 = this;
            local_1a8 = string;
            while( true ) {
              local_1d0 = local_1d0 + 1;
              bVar2 = XMLParseTools::ReadAttribute(&local_1d0,&local_178,&local_198);
              if (!bVar2) break;
              iVar3 = ::std::__cxx11::string::compare((char *)&local_178);
              if (iVar3 == 0) {
                ::std::__cxx11::string::_M_assign((string *)local_1d8);
              }
              iVar3 = ::std::__cxx11::string::compare((char *)&local_178);
              if (iVar3 == 0) {
                ::std::__cxx11::string::_M_assign((string *)&this->content);
              }
            }
            pSVar5 = (StreamMemory *)operator_new(0x170);
            StreamMemory::StreamMemory(pSVar5,local_1a8,(long)local_1a0 - (long)local_1a8);
            pTVar1 = local_1d8;
            local_200._M_head_impl = pSVar5;
            pUVar6 = Stream::GetSourceURL(local_1e0);
            pcVar4 = local_1e8;
            StreamMemory::SetSourceURL(pSVar5,pUVar6);
            XMLParser::XMLParser(&local_150,(Element *)0x0);
            BaseXMLParser::Parse
                      (&local_150.super_BaseXMLParser,&(local_200._M_head_impl)->super_Stream);
            this_00._M_head_impl = local_200._M_head_impl;
            local_200._M_head_impl = (StreamMemory *)0x0;
            if (this_00._M_head_impl != (StreamMemory *)0x0) {
              StreamMemory::~StreamMemory(this_00._M_head_impl);
              operator_delete(this_00._M_head_impl,0x170);
            }
            pDVar7 = XMLParser::GetDocumentHeader(&local_150);
            ::std::__cxx11::string::_M_assign((string *)&pTVar1->header);
            ::std::__cxx11::string::_M_assign((string *)&(pTVar1->header).title);
            ::std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&(pTVar1->header).template_resources,&pDVar7->template_resources);
            ::std::
            vector<Rml::DocumentHeader::Resource,_std::allocator<Rml::DocumentHeader::Resource>_>::
            operator=(&(pTVar1->header).rcss,&pDVar7->rcss);
            ::std::
            vector<Rml::DocumentHeader::Resource,_std::allocator<Rml::DocumentHeader::Resource>_>::
            operator=(&(pTVar1->header).scripts,&pDVar7->scripts);
            pSVar5 = (StreamMemory *)operator_new(0x170);
            local_1f8 = local_1f8 + -(long)pcVar4;
            StreamMemory::StreamMemory(pSVar5,(size_t)local_1f8);
            local_158._M_t.
            super__Tuple_impl<0UL,_Rml::StreamMemory_*,_std::default_delete<Rml::StreamMemory>_>.
            super__Head_base<0UL,_Rml::StreamMemory_*,_false>._M_head_impl =
                 (tuple<Rml::StreamMemory_*,_std::default_delete<Rml::StreamMemory>_>)
                 (_Tuple_impl<0UL,_Rml::StreamMemory_*,_std::default_delete<Rml::StreamMemory>_>)0x0
            ;
            ::std::__uniq_ptr_impl<Rml::StreamMemory,_std::default_delete<Rml::StreamMemory>_>::
            reset((__uniq_ptr_impl<Rml::StreamMemory,_std::default_delete<Rml::StreamMemory>_> *)
                  &pTVar1->body,pSVar5);
            ::std::unique_ptr<Rml::StreamMemory,_std::default_delete<Rml::StreamMemory>_>::
            ~unique_ptr((unique_ptr<Rml::StreamMemory,_std::default_delete<Rml::StreamMemory>_> *)
                        &local_158);
            pSVar5 = (pTVar1->body)._M_t.
                     super___uniq_ptr_impl<Rml::StreamMemory,_std::default_delete<Rml::StreamMemory>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_Rml::StreamMemory_*,_std::default_delete<Rml::StreamMemory>_>
                     .super__Head_base<0UL,_Rml::StreamMemory_*,_false>._M_head_impl;
            pUVar6 = Stream::GetSourceURL(local_1e0);
            pcVar4 = local_1e8;
            StreamMemory::SetSourceURL(pSVar5,pUVar6);
            Stream::PushBack(&((pTVar1->body)._M_t.
                               super___uniq_ptr_impl<Rml::StreamMemory,_std::default_delete<Rml::StreamMemory>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_Rml::StreamMemory_*,_std::default_delete<Rml::StreamMemory>_>
                               .super__Head_base<0UL,_Rml::StreamMemory_*,_false>._M_head_impl)->
                              super_Stream,pcVar4,(size_t)local_1f8);
            XMLParser::~XMLParser(&local_150);
            ::std::unique_ptr<Rml::StreamMemory,_std::default_delete<Rml::StreamMemory>_>::
            ~unique_ptr((unique_ptr<Rml::StreamMemory,_std::default_delete<Rml::StreamMemory>_> *)
                        &local_200);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_198._M_dataplus._M_p != &local_198.field_2) {
            operator_delete(local_198._M_dataplus._M_p,
                            CONCAT71(local_198.field_2._M_allocated_capacity._1_7_,
                                     local_198.field_2._M_local_buf[0]) + 1);
          }
          uVar8 = local_1ec;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_178._M_dataplus._M_p != &local_178.field_2) {
            operator_delete(local_178._M_dataplus._M_p,
                            CONCAT71(local_178.field_2._M_allocated_capacity._1_7_,
                                     local_178.field_2._M_local_buf[0]) + 1);
          }
          goto LAB_0028bda4;
        }
      }
    }
  }
  uVar8 = 0;
LAB_0028bda4:
  if (local_1c8 != &local_1b8) {
    operator_delete(local_1c8,CONCAT71(uStack_1b7,local_1b8) + 1);
  }
  return SUB41(uVar8,0);
}

Assistant:

bool Template::Load(Stream* stream)
{
	// Load the entire template into memory so we can pull out
	// the header and body tags
	String buffer;
	stream->Read(buffer, stream->Length());

	// Pull out the header
	const char* head_start = XMLParseTools::FindTag("head", buffer.c_str());
	if (!head_start)
		return false;

	const char* head_end = XMLParseTools::FindTag("head", head_start, true);
	if (!head_end)
		return false;
	// Advance to the end of the tag
	head_end = strchr(head_end, '>') + 1;

	// Pull out the body
	const char* body_start = XMLParseTools::FindTag("body", head_end);
	if (!body_start)
		return false;

	const char* body_end = XMLParseTools::FindTag("body", body_start, true);
	if (!body_end)
		return false;
	// Advance to the end of the tag
	body_end = strchr(body_end, '>') + 1;

	// Find the RML tag, skip over it and read the attributes,
	// storing the ones we're interested in.
	String attribute_name;
	String attribute_value;
	const char* ptr = XMLParseTools::FindTag("template", buffer.c_str());
	if (!ptr)
		return false;

	while (XMLParseTools::ReadAttribute(++ptr, attribute_name, attribute_value))
	{
		if (attribute_name == "name")
			name = attribute_value;
		if (attribute_name == "content")
			content = attribute_value;
	}

	// Create a stream around the header, parse it and store it
	auto header_stream = MakeUnique<StreamMemory>((const byte*)head_start, head_end - head_start);
	header_stream->SetSourceURL(stream->GetSourceURL());

	XMLParser parser(nullptr);
	parser.Parse(header_stream.get());

	header_stream.reset();

	header = *parser.GetDocumentHeader();

	// Store the body in stream form
	body = MakeUnique<StreamMemory>(body_end - body_start);
	body->SetSourceURL(stream->GetSourceURL());
	body->PushBack(body_start, body_end - body_start);

	return true;
}